

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall QObjectPrivate::QObjectPrivate(QObjectPrivate *this,QtPrivate_6_10_0 param_2)

{
  undefined4 in_ESI;
  QThreadData *in_RDI;
  QObjectData *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff0;
  
  QObjectData::QObjectData(unaff_retaddr);
  (in_RDI->eventLoops).super_QList<QEventLoop_*>.d.d = (Data *)&PTR__QObjectPrivate_00be72e0;
  QAtomicPointer<QThreadData>::QAtomicPointer
            ((QAtomicPointer<QThreadData> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDI);
  QAtomicPointer<QObjectPrivate::ConnectionData>::QAtomicPointer
            ((QAtomicPointer<QObjectPrivate::ConnectionData> *)
             CONCAT44(in_ESI,in_stack_fffffffffffffff0),(ConnectionData *)in_RDI);
  (in_RDI->tls).d.d = (Data *)0x0;
  QAtomicPointer<QtSharedPointer::ExternalRefCountData>::QAtomicPointer
            ((QAtomicPointer<QtSharedPointer::ExternalRefCountData> *)
             CONCAT44(in_ESI,in_stack_fffffffffffffff0),(ExternalRefCountData *)in_RDI);
  (in_RDI->eventLoops).super_QList<QEventLoop_*>.d.ptr = (QEventLoop **)0x0;
  (in_RDI->eventLoops).super_QList<QEventLoop_*>.d.size = 0;
  (in_RDI->postEventList).recursion = (in_RDI->postEventList).recursion & 0xfffffffe;
  (in_RDI->postEventList).recursion = (in_RDI->postEventList).recursion & 0xfffffffd;
  (in_RDI->postEventList).recursion = (in_RDI->postEventList).recursion & 0xfffffffb;
  (in_RDI->postEventList).recursion = (in_RDI->postEventList).recursion & 0xfffffff7;
  (in_RDI->postEventList).recursion = (in_RDI->postEventList).recursion & 0xffffffefU | 0x10;
  (in_RDI->postEventList).recursion = (in_RDI->postEventList).recursion & 0xffffffdfU | 0x20;
  QBasicAtomicInteger<int>::storeRelaxed
            ((QBasicAtomicInteger<int> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (int)((ulong)in_RDI >> 0x20));
  (in_RDI->thread).super_QBasicAtomicPointer<QThread>._q_value._M_b._M_p = (__pointer_type)0x0;
  (in_RDI->postEventList).startOffset = 0;
  (in_RDI->postEventList).recursion = (in_RDI->postEventList).recursion & 0xffffffbf;
  (in_RDI->postEventList).recursion = (in_RDI->postEventList).recursion & 0xffffff7f;
  (in_RDI->postEventList).recursion = (in_RDI->postEventList).recursion & 0xfffffeff;
  (in_RDI->postEventList).recursion = (in_RDI->postEventList).recursion & 0xfffffdff;
  (in_RDI->postEventList).recursion = (in_RDI->postEventList).recursion & 0xfffffbff;
  (in_RDI->postEventList).recursion = (in_RDI->postEventList).recursion & 0xfffff7ff;
  return;
}

Assistant:

QObjectPrivate::QObjectPrivate(decltype(QObjectPrivateVersion))
    : threadData(nullptr), currentChildBeingDeleted(nullptr)
{
    // QObjectData initialization
    q_ptr = nullptr;
    parent = nullptr;                           // no parent yet. It is set by setParent()
    isWidget = false;                           // assume not a widget object
    blockSig = false;                           // not blocking signals
    wasDeleted = false;                         // double-delete catcher
    isDeletingChildren = false;                 // set by deleteChildren()
    sendChildEvents = true;                     // if we should send ChildAdded and ChildRemoved events to parent
    receiveChildEvents = true;
    postedEvents.storeRelaxed(0);
    extraData = nullptr;
    metaObject = nullptr;
    isWindow = false;
    deleteLaterCalled = false;
    isQuickItem = false;
    willBeWidget = false;
    wasWidget = false;
    receiveParentEvents = false;                // If object wants ParentAboutToChange and ParentChange
}